

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessNoImplicitCallDef(BackwardPass *this,Instr *instr)

{
  BVIndex i;
  Opnd *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  Opnd *this_02;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOLEAN BVar4;
  BOOLEAN BVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1183,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar2) goto LAB_003d0c5c;
    *puVar6 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1184,"(instr)","instr");
    if (!bVar2) goto LAB_003d0c5c;
    *puVar6 = 0;
  }
  this_00 = instr->m_dst;
  if (this_00 == (Opnd *)0x0) {
    return;
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 == OpndKindSym) {
    pSVar8 = IR::Opnd::AsSymOpnd(this_00);
    pSVar9 = (StackSym *)pSVar8->m_sym;
    if ((pSVar9->super_Sym).m_kind != SymKindProperty) {
      return;
    }
  }
  else {
    if (OVar3 != OpndKindReg) {
      return;
    }
    pRVar7 = IR::Opnd::AsRegOpnd(this_00);
    pSVar9 = pRVar7->m_sym;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallUses,(pSVar9->super_Sym).m_id);
  this_01 = this->currentBlock->noImplicitCallNoMissingValuesUses;
  i = (pSVar9->super_Sym).m_id;
  if (BVar4 != '\0') {
    BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear(this_01,i);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (this->currentBlock->noImplicitCallNativeArrayUses,(pSVar9->super_Sym).m_id);
    uStack_38 = CONCAT17(BVar5,(undefined7)uStack_38);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                       (pSVar9->super_Sym).m_id);
    uStack_38._0_7_ = CONCAT16(BVar5,(undefined6)uStack_38);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (this->currentBlock->noImplicitCallArrayLengthSymUses,(pSVar9->super_Sym).m_id
                      );
    uStack_38._0_6_ = CONCAT15(BVar5,(undefined5)uStack_38);
    this_02 = instr->m_src1;
    if (this_02 == (Opnd *)0x0) {
      return;
    }
    if ((instr->m_src2 != (Opnd *)0x0) &&
       (bVar2 = OpCodeAttr::NonIntTransfer(instr->m_opcode), !bVar2)) {
      return;
    }
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if ((bVar2) && (bVar2 = IR::Opnd::IsRegOpnd(this_02), bVar2)) {
      bVar2 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
    }
    else {
      bVar2 = IR::Opnd::IsRegOpnd(this_00);
      if ((!bVar2) ||
         ((bVar2 = IR::Opnd::IsSymOpnd(this_02), !bVar2 ||
          (pSVar8 = IR::Opnd::AsSymOpnd(this_02), pSVar8->m_sym->m_kind != SymKindProperty)))) {
        bVar2 = IR::Opnd::IsRegOpnd(this_02);
        if (!bVar2) {
          return;
        }
        uStack_38._0_4_ = CONCAT22((this_00->m_valueType).field_0.bits,(undefined2)uStack_38);
        bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 2));
        if (!bVar2) {
          return;
        }
      }
      bVar2 = IR::Instr::TransfersSrcValue(instr);
    }
    if (bVar2 != false) {
      OVar3 = IR::Opnd::GetKind(this_02);
      if (OVar3 == OpndKindSym) {
        pSVar8 = IR::Opnd::AsSymOpnd(this_02);
        pSVar9 = (StackSym *)pSVar8->m_sym;
        if ((pSVar9->super_Sym).m_kind != SymKindProperty) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x11d5,"(srcSym->IsPropertySym())","srcSym->IsPropertySym()");
          if (!bVar2) goto LAB_003d0c5c;
          *puVar6 = 0;
        }
      }
      else {
        if (OVar3 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                     ,0x11d9,"(false)","false");
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        pRVar7 = IR::Opnd::AsRegOpnd(this_02);
        pSVar9 = pRVar7->m_sym;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallUses,(pSVar9->super_Sym).m_id);
      if (BVar4 != '\0') {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallNoMissingValuesUses,(pSVar9->super_Sym).m_id);
      }
      if (uStack_38._7_1_ != '\0') {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallNativeArrayUses,(pSVar9->super_Sym).m_id);
      }
      if (uStack_38._6_1_ != '\0') {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                   (pSVar9->super_Sym).m_id);
      }
      if (uStack_38._5_1_ != '\0') {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallArrayLengthSymUses,(pSVar9->super_Sym).m_id);
      }
    }
    return;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test(this_01,i);
  if (BVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a1,
                       "(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id))",
                       "!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id)");
    if (!bVar2) goto LAB_003d0c5c;
    *puVar6 = 0;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->currentBlock->noImplicitCallNativeArrayUses,(pSVar9->super_Sym).m_id);
  if (BVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a2,"(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id))",
                       "!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id)");
    if (!bVar2) goto LAB_003d0c5c;
    *puVar6 = 0;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                     (pSVar9->super_Sym).m_id);
  if (BVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a3,
                       "(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id))"
                       ,"!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id)"
                      );
    if (!bVar2) goto LAB_003d0c5c;
    *puVar6 = 0;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->currentBlock->noImplicitCallArrayLengthSymUses,(pSVar9->super_Sym).m_id);
  if (BVar4 == '\0') {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                     ,0x11a4,"(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id))"
                     ,"!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id)");
  if (bVar2) {
    *puVar6 = 0;
    return;
  }
LAB_003d0c5c:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
BackwardPass::ProcessNoImplicitCallDef(IR::Instr *const instr)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(instr);

    IR::Opnd *const dst = instr->GetDst();
    if(!dst)
    {
        return;
    }

    Sym *dstSym;
    switch(dst->GetKind())
    {
        case IR::OpndKindReg:
            dstSym = dst->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            dstSym = dst->AsSymOpnd()->m_sym;
            if(!dstSym->IsPropertySym())
            {
                return;
            }
            break;

        default:
            return;
    }

    if(!currentBlock->noImplicitCallUses->TestAndClear(dstSym->m_id))
    {
        Assert(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id));
        return;
    }
    const bool transferNoMissingValuesUse = !!currentBlock->noImplicitCallNoMissingValuesUses->TestAndClear(dstSym->m_id);
    const bool transferNativeArrayUse = !!currentBlock->noImplicitCallNativeArrayUses->TestAndClear(dstSym->m_id);
    const bool transferJsArrayHeadSegmentSymUse =
        !!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->TestAndClear(dstSym->m_id);
    const bool transferArrayLengthSymUse = !!currentBlock->noImplicitCallArrayLengthSymUses->TestAndClear(dstSym->m_id);

    IR::Opnd *const src = instr->GetSrc1();

    // Stop attempting to transfer noImplicitCallUses symbol if the instr is not a transfer instr (based on the opcode's 
    // flags) or does not have the attributes to be a transfer instr (based on the existance of src and src2).
    if(!src || (instr->GetSrc2() && !OpCodeAttr::NonIntTransfer(instr->m_opcode)))
    {
        return;
    }
    if(dst->IsRegOpnd() && src->IsRegOpnd())
    {
        if(!OpCodeAttr::NonIntTransfer(instr->m_opcode))
        {
            return;
        }
    }
    else if(
        !(
            // LdFld or similar
            (dst->IsRegOpnd() && src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym()) ||

            // StFld or similar. Don't transfer a field opnd from StFld into the reg opnd src unless the field's value type is
            // definitely array or object with array, because only those value types require implicit calls to be disabled as
            // long as they are live. Other definite value types only require implicit calls to be disabled as long as a live
            // field holds the value, which is up to the StFld when going backwards.
            (src->IsRegOpnd() && dst->GetValueType().IsArrayOrObjectWithArray())
        ) ||
        !instr->TransfersSrcValue())
    {
        return;
    }

    Sym *srcSym = nullptr;
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            srcSym = src->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            srcSym = src->AsSymOpnd()->m_sym;
            Assert(srcSym->IsPropertySym());
            break;

        default:
            Assert(false);
            __assume(false);
    }

    currentBlock->noImplicitCallUses->Set(srcSym->m_id);
    if(transferNoMissingValuesUse)
    {
        currentBlock->noImplicitCallNoMissingValuesUses->Set(srcSym->m_id);
    }
    if(transferNativeArrayUse)
    {
        currentBlock->noImplicitCallNativeArrayUses->Set(srcSym->m_id);
    }
    if(transferJsArrayHeadSegmentSymUse)
    {
        currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Set(srcSym->m_id);
    }
    if(transferArrayLengthSymUse)
    {
        currentBlock->noImplicitCallArrayLengthSymUses->Set(srcSym->m_id);
    }
}